

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broadcast_socket.cpp
# Opt level: O0

bool libtorrent::is_link_local(address *a)

{
  bool bVar1;
  unsigned_long uVar2;
  bool local_41;
  unsigned_long ip;
  undefined1 local_30 [4];
  address_v4 a4;
  address_v6 a6;
  address *a_local;
  
  bVar1 = boost::asio::ip::address::is_v6(a);
  if (bVar1) {
    boost::asio::ip::address::to_v6((address_v6 *)local_30,a);
    bVar1 = boost::asio::ip::address_v6::is_link_local((address_v6 *)local_30);
    local_41 = true;
    if (!bVar1) {
      local_41 = boost::asio::ip::address_v6::is_multicast_link_local((address_v6 *)local_30);
    }
    a_local._7_1_ = local_41;
  }
  else {
    boost::asio::ip::address::to_v4((address *)((long)&ip + 4));
    uVar2 = boost::asio::ip::address_v4::to_ulong((address_v4 *)((long)&ip + 4));
    a_local._7_1_ = (uVar2 & 0xffff0000) == 0xa9fe0000;
  }
  return a_local._7_1_;
}

Assistant:

bool is_link_local(address const& a)
	{
		if (a.is_v6())
		{
			address_v6 const a6 = a.to_v6();
			return a6.is_link_local()
				|| a6.is_multicast_link_local();
		}
		address_v4 const a4 = a.to_v4();
		unsigned long ip = a4.to_ulong();
		return (ip & 0xffff0000) == 0xa9fe0000; // 169.254.x.x
	}